

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O3

void cilk_fiber_pool_init
               (cilk_fiber_pool *pool,cilk_fiber_pool *parent,size_t stack_size,uint buffer_size,
               int alloc_max,int is_shared)

{
  spin_mutex *psVar1;
  cilk_fiber **ppcVar2;
  
  if (is_shared == 0) {
    psVar1 = (spin_mutex *)0x0;
  }
  else {
    psVar1 = spin_mutex_create();
  }
  pool->lock = psVar1;
  pool->parent = parent;
  pool->stack_size = stack_size;
  pool->max_size = buffer_size;
  pool->size = 0;
  pool->total = 0;
  pool->high_water = 0;
  pool->alloc_max = alloc_max;
  ppcVar2 = (cilk_fiber **)__cilkrts_malloc((ulong)buffer_size << 3);
  pool->fibers = ppcVar2;
  if (ppcVar2 != (cilk_fiber **)0x0) {
    return;
  }
  cilk_fiber_pool_init_cold_1();
}

Assistant:

void cilk_fiber_pool_init(cilk_fiber_pool* pool,
                          cilk_fiber_pool* parent,
                          size_t           stack_size,
                          unsigned         buffer_size,
                          int              alloc_max,
                          int              is_shared)
{
#if FIBER_DEBUG >= 1    
    fprintf(stderr, "fiber_pool_init, pool=%p, parent=%p, alloc_max=%u\n",
            pool, parent, alloc_max);
#endif

    pool->lock       = (is_shared ? spin_mutex_create() : NULL);
    pool->parent     = parent;
    pool->stack_size = stack_size;
    pool->max_size   = buffer_size;
    pool->size       = 0;
    pool->total      = 0;
    pool->high_water = 0;
    pool->alloc_max  = alloc_max;
    pool->fibers     =
        (cilk_fiber**) __cilkrts_malloc(buffer_size * sizeof(cilk_fiber*));
    CILK_ASSERT(NULL != pool->fibers);

#ifdef __MIC__
#define PREALLOCATE_FIBERS
#endif
    
#ifdef PREALLOCATE_FIBERS
    // Pre-allocate 1/4 of fibers in the pools ahead of time.  This
    // value is somewhat arbitrary.  It was chosen to be less than the
    // threshold (of about 3/4) of fibers to keep in the pool when
    // transferring fibers to the parent.
    
    int pre_allocate_count = buffer_size/4;
    for (pool->size = 0; pool->size < pre_allocate_count; pool->size++) {
        pool->fibers[pool->size] = cilk_fiber::allocate_from_heap(pool->stack_size);
    }
#endif
}